

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_diff.cpp
# Opt level: O3

long duckdb::DateDiffTernaryOperator::
     Operation<duckdb::string_t,duckdb::dtime_t,duckdb::dtime_t,long>
               (string_t part,dtime_t startdate,dtime_t enddate,ValidityMask *mask,idx_t idx)

{
  DatePartSpecifier DVar1;
  ulong uVar2;
  NotImplementedException *this;
  ulong uVar3;
  long lVar4;
  long lVar5;
  dtime_t enddate_00;
  dtime_t startdate_00;
  string local_78;
  string local_58;
  undefined8 local_38;
  long local_30;
  
  local_30 = part.value._8_8_;
  local_38 = part.value._0_8_;
  startdate_00.micros = (int64_t)&local_78;
  enddate_00.micros = local_30;
  if (part.value._0_4_ < 0xd) {
    enddate_00.micros = (long)&local_38 + 4;
  }
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_78,enddate_00.micros,(ulong)part.value._0_4_ + enddate_00.micros);
  DVar1 = GetDatePartSpecifier(&local_78);
  switch(DVar1) {
  case BEGIN_BIGINT:
    DateDiff::YearOperator::Operation<duckdb::dtime_t,duckdb::dtime_t,long>(startdate_00,enddate_00)
    ;
  case MONTH:
    DateDiff::MonthOperator::Operation<duckdb::dtime_t,duckdb::dtime_t,long>
              (startdate_00,enddate_00);
  case DAY:
  case DOW:
  case ISODOW:
  case DOY:
  case JULIAN_DAY:
    DateDiff::DayOperator::Operation<duckdb::dtime_t,duckdb::dtime_t,long>(startdate_00,enddate_00);
  case DECADE:
    DateDiff::DecadeOperator::Operation<duckdb::dtime_t,duckdb::dtime_t,long>
              (startdate_00,enddate_00);
  case CENTURY:
    DateDiff::CenturyOperator::Operation<duckdb::dtime_t,duckdb::dtime_t,long>
              (startdate_00,enddate_00);
  case MILLENNIUM:
    DateDiff::MilleniumOperator::Operation<duckdb::dtime_t,duckdb::dtime_t,long>
              (startdate_00,enddate_00);
  case MICROSECONDS:
    lVar5 = enddate.micros - startdate.micros;
    goto LAB_01b08999;
  case MILLISECONDS:
    lVar5 = enddate.micros / 1000;
    uVar3 = SUB168(SEXT816(startdate.micros) * SEXT816(-0x20c49ba5e353f7cf),8);
    uVar2 = uVar3 >> 0x3f;
    lVar4 = (long)uVar3 >> 7;
    break;
  case SECOND:
  case BEGIN_DOUBLE:
    lVar5 = enddate.micros / 1000000;
    uVar3 = SUB168(SEXT816(startdate.micros) * SEXT816(-0x431bde82d7b634db),8);
    uVar2 = uVar3 >> 0x3f;
    lVar4 = (long)uVar3 >> 0x12;
    break;
  case MINUTE:
    lVar5 = enddate.micros / 60000000;
    uVar3 = SUB168(SEXT816(startdate.micros) * SEXT816(0x70d59cc6bc5928d7),8) - startdate.micros;
    uVar2 = uVar3 >> 0x3f;
    lVar4 = (long)uVar3 >> 0x19;
    break;
  case HOUR:
    lVar5 = enddate.micros / 3600000000;
    uVar3 = SUB168(SEXT816(startdate.micros) * SEXT816(0x674a40d3fc1ad63b),8) - startdate.micros;
    uVar2 = uVar3 >> 0x3f;
    lVar4 = (long)uVar3 >> 0x1f;
    break;
  case WEEK:
  case YEARWEEK:
    DateDiff::WeekOperator::Operation<duckdb::dtime_t,duckdb::dtime_t,long>(startdate_00,enddate_00)
    ;
  case ISOYEAR:
    DateDiff::ISOYearOperator::Operation<duckdb::dtime_t,duckdb::dtime_t,long>
              (startdate_00,enddate_00);
  case QUARTER:
    DateDiff::QuarterOperator::Operation<duckdb::dtime_t,duckdb::dtime_t,long>
              (startdate_00,enddate_00);
  default:
    this = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_58,"Specifier type not implemented for DATEDIFF","");
    NotImplementedException::NotImplementedException(this,&local_58);
    __cxa_throw(this,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  }
  lVar5 = lVar4 + uVar2 + lVar5;
LAB_01b08999:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  return lVar5;
}

Assistant:

static inline TR Operation(TS part, TA startdate, TB enddate, ValidityMask &mask, idx_t idx) {
		if (Value::IsFinite(startdate) && Value::IsFinite(enddate)) {
			return DifferenceDates<TA, TB, TR>(GetDatePartSpecifier(part.GetString()), startdate, enddate);
		} else {
			mask.SetInvalid(idx);
			return TR();
		}
	}